

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

QMetaTypeInterface * interfaceForTypeNoWarning(int typeId)

{
  int iVar1;
  Type *this;
  QMetaTypeModuleHelper **ppQVar2;
  undefined4 extraout_var;
  QMetaTypeInterface *pQVar3;
  anon_struct_8_1_2f67eb89 *paVar4;
  
  if (0xffff < typeId) {
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::
        Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::guard.
        _q_value.super___atomic_base<signed_char>._M_i != -1) {
      return (QMetaTypeInterface *)0x0;
    }
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
           ::instance();
    QReadWriteLock::lockForRead(&this->lock);
    if ((ulong)(long)(typeId + -0x10001) < (ulong)(this->registry).d.size) {
      pQVar3 = (this->registry).d.ptr[typeId + -0x10001];
    }
    else {
      pQVar3 = (QMetaTypeInterface *)0x0;
    }
    QReadWriteLock::unlock(&this->lock);
    return pQVar3;
  }
  if (typeId < 0x40) {
    paVar4 = &metatypeHelper;
  }
  else {
    if (typeId - 0x1000U < 0x18) {
      ppQVar2 = &qMetaTypeGuiHelper;
    }
    else {
      if (typeId != 0x2000) {
        paVar4 = (anon_struct_8_1_2f67eb89 *)0x0;
        goto LAB_00296e0f;
      }
      ppQVar2 = &qMetaTypeWidgetsHelper;
    }
    paVar4 = (anon_struct_8_1_2f67eb89 *)*ppQVar2;
  }
LAB_00296e0f:
  if (&paVar4->super_QMetaTypeModuleHelper == (QMetaTypeModuleHelper *)0x0) {
    return (QMetaTypeInterface *)0x0;
  }
  iVar1 = (**(paVar4->super_QMetaTypeModuleHelper)._vptr_QMetaTypeModuleHelper)(paVar4,typeId);
  return (QMetaTypeInterface *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static const QtPrivate::QMetaTypeInterface *interfaceForTypeNoWarning(int typeId)
{
    const QtPrivate::QMetaTypeInterface *iface = nullptr;
    if (typeId >= QMetaType::User) {
#ifndef QT_BOOTSTRAPPED
        if (customTypeRegistry.exists())
            iface = customTypeRegistry->getCustomType(typeId);
#endif
    } else {
        if (auto moduleHelper = qModuleHelperForType(typeId))
            iface = moduleHelper->interfaceForType(typeId);
    }
    return iface;
}